

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

List * string_to_list(char *string,char **include_dirs)

{
  int __fd;
  BOOL BVar1;
  int *piVar2;
  char *pcVar3;
  FILE *pFVar4;
  List *pLVar5;
  FILE *pFVar6;
  FILE *local_188;
  char acStack_178 [4];
  int fd;
  char filename [32];
  char buf [256];
  undefined1 local_50 [8];
  Token t;
  List *enclosing_list;
  FILE *temp;
  char **include_dirs_local;
  char *string_local;
  
  if (string_to_list::busy_p != 0) {
    __assert_fail("!busy_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                  ,0x21c,"List *string_to_list(const char *, const char **)");
  }
  string_to_list::busy_p = 1;
  builtin_strncpy(acStack_178,"/tmp",4);
  fd._0_1_ = '/';
  fd._1_1_ = 's';
  fd._2_1_ = 'y';
  fd._3_1_ = 'n';
  builtin_strncpy(filename,"genXXXXXX",10);
  filename[10] = '\0';
  filename[0xb] = '\0';
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = '\0';
  filename[0xf] = '\0';
  filename[0x10] = '\0';
  filename[0x11] = '\0';
  filename[0x12] = '\0';
  filename[0x13] = '\0';
  filename[0x14] = '\0';
  filename[0x15] = '\0';
  filename[0x16] = '\0';
  filename[0x17] = '\0';
  __fd = mkstemp(acStack_178);
  if (__fd == 0) {
    local_188 = (FILE *)0x0;
  }
  else {
    local_188 = fdopen(__fd,"w");
  }
  if (local_188 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fatal_error("string_to_list: Unable to create temp file!  %s\n",pcVar3);
  }
  fputs(string,local_188);
  fclose(local_188);
  open_file(acStack_178,(char **)0x0);
  pFVar4 = current_stream();
  BVar1 = fetch_next_token((Token *)local_50);
  if (BVar1 == FALSE) {
    fatal_error("Empty expression specified.\n");
    string_local = (char *)0x0;
  }
  else if (local_50._0_4_ == TOK_LEFT_PAREN) {
    t.lineno = (unsigned_long)alloc_list();
    pLVar5 = parse_expression();
    *(List **)(t.lineno + 8) = pLVar5;
    *(undefined4 *)(t.lineno + 0x10) = 0x4c;
    *(char **)(t.lineno + 0x18) = "[LIST]";
    *(undefined8 *)(t.lineno + 0x28) = 1;
    *(char **)(t.lineno + 0x20) = "<command line>";
    pFVar6 = current_stream();
    if (pFVar6 == pFVar4) {
      close_file();
      pFVar6 = current_stream();
      if (pFVar6 == pFVar4) {
        __assert_fail("current_stream () != temp",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                      ,0x252,"List *string_to_list(const char *, const char **)");
      }
    }
    unlink(acStack_178);
    string_to_list::busy_p = 0;
    string_local = (char *)t.lineno;
  }
  else {
    pcVar3 = unparse_token((Token *)local_50,filename + 0x18);
    input_error("Expression must begin with open paren, not \"%s\"\n",pcVar3);
    string_local = (char *)0x0;
  }
  return (List *)string_local;
}

Assistant:

List *
string_to_list (const char *string, const char *include_dirs[])
{
  FILE *temp;
  List *enclosing_list;
  Token t;
  char buf[256];
  static int busy_p = FALSE;

  assert (!busy_p);
  busy_p = TRUE;

  /* POOR IMPLEMENTATION - creates temp file to get a FILE * ! */
#if defined(_WIN32)
  char filename[32] = "syngenXXXXXX";
  mktemp(filename);
  temp = fopen(filename, "w");
#else
  char filename[32] = "/tmp/syngenXXXXXX";
  int fd = mkstemp (filename);
  temp = fd ? fdopen (fd, "w") : NULL;
#endif
  if (temp == NULL)
    {
#if !defined (__MINGW32__)
      extern int errno;
      fatal_error ("string_to_list: Unable to create temp file!  %s\n",
		   strerror (errno));
#else
      fatal_error ("string_to_list: Unable to create temp file!\n");
#endif
    }

  fputs (string, temp);
  fclose (temp);
  open_file (filename, NULL);
  temp = current_stream ();

  if (!fetch_next_token (&t))
    {
      fatal_error ("Empty expression specified.\n");
      return NULL;
    }
  if (t.type != TOK_LEFT_PAREN)
    {
      input_error ("Expression must begin with open paren, not \"%s\"\n",
		   unparse_token (&t, buf));
      return NULL;
    }
 
  enclosing_list = alloc_list ();
  enclosing_list->car = parse_expression ();
  enclosing_list->token.type     = TOK_LIST;
  enclosing_list->token.u.string = "[LIST]";
  enclosing_list->token.lineno   = 1;
  enclosing_list->token.filename = "<command line>";

  /* No need to fclose here; that will automatically happen when
   * the parser runs out of tokens for this file.
   */
  if (current_stream () == temp)
    {
      close_file ();
      assert (current_stream () != temp);
    }

  unlink (filename);

  busy_p = FALSE;

  return enclosing_list;
}